

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_ByteString_allocBuffer(UA_ByteString *bs,size_t length)

{
  UA_Byte *pUVar1;
  size_t length_local;
  UA_ByteString *bs_local;
  
  UA_ByteString_init(bs);
  if (length == 0) {
    bs_local._4_4_ = 0;
  }
  else {
    pUVar1 = (UA_Byte *)malloc(length);
    bs->data = pUVar1;
    if (pUVar1 == (UA_Byte *)0x0) {
      bs_local._4_4_ = 0x80030000;
    }
    else {
      bs->length = length;
      bs_local._4_4_ = 0;
    }
  }
  return bs_local._4_4_;
}

Assistant:

UA_StatusCode
UA_ByteString_allocBuffer(UA_ByteString *bs, size_t length) {
    UA_ByteString_init(bs);
    if(length == 0)
        return UA_STATUSCODE_GOOD;
    if(!(bs->data = (UA_Byte*)UA_malloc(length)))
        return UA_STATUSCODE_BADOUTOFMEMORY;
    bs->length = length;
    return UA_STATUSCODE_GOOD;
}